

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O2

SQRESULT sq_throwobject(HSQUIRRELVM v)

{
  SQObjectPtr *obj;
  
  obj = SQVM::GetUp(v,-1);
  SQObjectPtr::operator=(&v->_lasterror,obj);
  SQVM::Pop(v);
  return -1;
}

Assistant:

SQRESULT sq_throwobject(HSQUIRRELVM v)
{
    v->_lasterror = v->GetUp(-1);
    v->Pop();
    return SQ_ERROR;
}